

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTRuntimeInfoTracker.cpp
# Opt level: O0

void __thiscall
TTD::RuntimeContextInfo::GatherKnownObjectToPathMap(RuntimeContextInfo *this,ScriptContext *ctx)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  BOOL BVar5;
  PropertyId propertyId;
  TypeId TVar6;
  GlobalObject *obj;
  JavascriptLibrary *pJVar7;
  RecyclableObject *pRVar8;
  Var aValue;
  JavascriptFunction *pJVar9;
  ScriptConfiguration *this_00;
  DynamicObject *pDVar10;
  Type *ppPVar11;
  RecyclableObject *val;
  ArrayObject *val_00;
  bool skipProto;
  RecyclableObject *proto;
  ArrayObject *parray;
  Var pvStack_88;
  BOOL isproperty;
  Var pitem;
  Var setter;
  Var getter;
  PropertyRecord *precord;
  RecyclableObject *pRStack_60;
  int32 i;
  RecyclableObject *curr;
  uint32 counter;
  undefined1 local_48 [8];
  List<const_Js::PropertyRecord_*,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  propertyRecordList;
  ScriptContext *ctx_local;
  RuntimeContextInfo *this_local;
  
  propertyRecordList._40_8_ = ctx;
  JsUtil::
  List<const_Js::PropertyRecord_*,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  ::List((List<const_Js::PropertyRecord_*,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
          *)local_48,&Memory::HeapAllocator::Instance,4);
  obj = Js::ScriptContextBase::GetGlobalObject((ScriptContextBase *)(propertyRecordList._40_8_ + 8))
  ;
  EnqueueRootPathObject(this,L"global",(RecyclableObject *)obj);
  pJVar7 = Js::ScriptContext::GetLibrary((ScriptContext *)propertyRecordList._40_8_);
  pRVar8 = Js::JavascriptLibraryBase::GetNull(&pJVar7->super_JavascriptLibraryBase);
  EnqueueRootPathObject(this,L"null",pRVar8);
  pJVar7 = Js::ScriptContext::GetLibrary((ScriptContext *)propertyRecordList._40_8_);
  aValue = Js::JavascriptLibrary::GetUndeclBlockVar(pJVar7);
  pRVar8 = Js::VarTo<Js::RecyclableObject>(aValue);
  EnqueueRootPathObject(this,L"undeclBlockVar",pRVar8);
  pJVar7 = Js::ScriptContext::GetLibrary((ScriptContext *)propertyRecordList._40_8_);
  pJVar9 = Js::JavascriptLibrary::GetDefaultAccessorFunction(pJVar7);
  EnqueueRootPathObject(this,L"_defaultAccessor",(RecyclableObject *)pJVar9);
  this_00 = Js::ScriptContext::GetConfig((ScriptContext *)propertyRecordList._40_8_);
  bVar1 = Js::ScriptConfiguration::IsErrorStackTraceEnabled(this_00);
  if (bVar1) {
    pJVar7 = Js::ScriptContext::GetLibrary((ScriptContext *)propertyRecordList._40_8_);
    pJVar9 = Js::JavascriptLibrary::GetStackTraceAccessorFunction(pJVar7);
    EnqueueRootPathObject(this,L"_stackTraceAccessor",(RecyclableObject *)pJVar9);
  }
  pJVar7 = Js::ScriptContext::GetLibrary((ScriptContext *)propertyRecordList._40_8_);
  pJVar9 = Js::JavascriptLibrary::GetThrowTypeErrorRestrictedPropertyAccessorFunction(pJVar7);
  EnqueueRootPathObject
            (this,L"_throwTypeErrorRestrictedPropertyAccessor",(RecyclableObject *)pJVar9);
  pJVar7 = Js::ScriptContext::GetLibrary((ScriptContext *)propertyRecordList._40_8_);
  pJVar9 = Js::JavascriptLibrary::GetIdentityFunction(pJVar7);
  EnqueueRootPathObject(this,L"_identityFunction",(RecyclableObject *)pJVar9);
  pJVar7 = Js::ScriptContext::GetLibrary((ScriptContext *)propertyRecordList._40_8_);
  pJVar9 = Js::JavascriptLibrary::GetThrowerFunction(pJVar7);
  EnqueueRootPathObject(this,L"_throwerFunction",(RecyclableObject *)pJVar9);
  bVar1 = Js::ScriptContext::IsJsBuiltInEnabled((ScriptContext *)propertyRecordList._40_8_);
  if (bVar1) {
    pJVar7 = Js::ScriptContext::GetLibrary((ScriptContext *)propertyRecordList._40_8_);
    Js::JavascriptLibrary::EnsureArrayBuiltInsAreReady(pJVar7);
  }
  pJVar7 = Js::ScriptContext::GetLibrary((ScriptContext *)propertyRecordList._40_8_);
  pDVar10 = Js::JavascriptLibraryBase::GetArrayIteratorPrototype
                      (&pJVar7->super_JavascriptLibraryBase);
  EnqueueRootPathObject(this,L"_arrayIteratorPrototype",&pDVar10->super_RecyclableObject);
  pJVar7 = Js::ScriptContext::GetLibrary((ScriptContext *)propertyRecordList._40_8_);
  pDVar10 = Js::JavascriptLibraryBase::GetMapIteratorPrototype(&pJVar7->super_JavascriptLibraryBase)
  ;
  EnqueueRootPathObject(this,L"_mapIteratorPrototype",&pDVar10->super_RecyclableObject);
  pJVar7 = Js::ScriptContext::GetLibrary((ScriptContext *)propertyRecordList._40_8_);
  pDVar10 = Js::JavascriptLibraryBase::GetSetIteratorPrototype(&pJVar7->super_JavascriptLibraryBase)
  ;
  EnqueueRootPathObject(this,L"_setIteratorPrototype",&pDVar10->super_RecyclableObject);
  pJVar7 = Js::ScriptContext::GetLibrary((ScriptContext *)propertyRecordList._40_8_);
  pDVar10 = Js::JavascriptLibraryBase::GetStringIteratorPrototype
                      (&pJVar7->super_JavascriptLibraryBase);
  EnqueueRootPathObject(this,L"_stringIteratorPrototype",&pDVar10->super_RecyclableObject);
  pJVar7 = Js::ScriptContext::GetLibrary((ScriptContext *)propertyRecordList._40_8_);
  pJVar9 = Js::JavascriptLibrary::EnsureGeneratorNextFunction(pJVar7);
  EnqueueRootPathObject(this,L"_generatorNextFunction",(RecyclableObject *)pJVar9);
  pJVar7 = Js::ScriptContext::GetLibrary((ScriptContext *)propertyRecordList._40_8_);
  pJVar9 = Js::JavascriptLibrary::EnsureGeneratorReturnFunction(pJVar7);
  EnqueueRootPathObject(this,L"_generatorReturnFunction",(RecyclableObject *)pJVar9);
  pJVar7 = Js::ScriptContext::GetLibrary((ScriptContext *)propertyRecordList._40_8_);
  pJVar9 = Js::JavascriptLibrary::EnsureGeneratorThrowFunction(pJVar7);
  EnqueueRootPathObject(this,L"_generatorThrowFunction",(RecyclableObject *)pJVar9);
  pJVar7 = Js::ScriptContext::GetLibrary((ScriptContext *)propertyRecordList._40_8_);
  pJVar9 = Js::JavascriptLibraryBase::GetGeneratorFunctionConstructor
                     (&pJVar7->super_JavascriptLibraryBase);
  EnqueueRootPathObject(this,L"_generatorFunctionConstructor",(RecyclableObject *)pJVar9);
  pJVar7 = Js::ScriptContext::GetLibrary((ScriptContext *)propertyRecordList._40_8_);
  pJVar9 = Js::JavascriptLibraryBase::GetAsyncFunctionConstructor
                     (&pJVar7->super_JavascriptLibraryBase);
  EnqueueRootPathObject(this,L"_asyncFunctionConstructor",(RecyclableObject *)pJVar9);
  curr._0_4_ = 0;
  do {
    bVar1 = JsUtil::Queue<Js::RecyclableObject_*,_Memory::HeapAllocator>::Empty(&this->m_worklist);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      SortDictIntoListOnNames<Js::RecyclableObject*>
                (&this->m_coreObjToPathMap,&this->m_sortedObjectList,&this->m_nullString);
      SortDictIntoListOnNames<Js::FunctionBody*>
                (&this->m_coreBodyToPathMap,&this->m_sortedFunctionBodyList,&this->m_nullString);
      SortDictIntoListOnNames<Js::DebuggerScope*>
                (&this->m_coreDbgScopeToPathMap,&this->m_sortedDbgScopeList,&this->m_nullString);
      JsUtil::
      List<const_Js::PropertyRecord_*,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
      ::~List((List<const_Js::PropertyRecord_*,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
               *)local_48);
      return;
    }
    pRStack_60 = JsUtil::Queue<Js::RecyclableObject_*,_Memory::HeapAllocator>::Dequeue
                           (&this->m_worklist);
    curr._0_4_ = (int)curr + 1;
    JsUtil::
    List<const_Js::PropertyRecord_*,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
    ::Clear((List<const_Js::PropertyRecord_*,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
             *)local_48);
    LoadAndOrderPropertyNames
              (pRStack_60,
               (List<const_Js::PropertyRecord_*,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                *)local_48);
    for (precord._4_4_ = 0; iVar4 = precord._4_4_,
        iVar2 = JsUtil::
                ReadOnlyList<const_Js::PropertyRecord_*,_Memory::HeapAllocator,_DefaultComparer>::
                Count((ReadOnlyList<const_Js::PropertyRecord_*,_Memory::HeapAllocator,_DefaultComparer>
                       *)local_48), iVar4 < iVar2; precord._4_4_ = precord._4_4_ + 1) {
      ppPVar11 = JsUtil::
                 List<const_Js::PropertyRecord_*,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                 ::Item((List<const_Js::PropertyRecord_*,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                         *)local_48,precord._4_4_);
      pRVar8 = pRStack_60;
      getter = *ppPVar11;
      setter = (Var)0x0;
      pitem = (Var)0x0;
      uVar3 = Js::PropertyRecord::GetPropertyId((PropertyRecord *)getter);
      iVar4 = (*(pRVar8->super_FinalizableObject).super_IRecyclerVisitedObject.
                _vptr_IRecyclerVisitedObject[0x15])
                        (pRVar8,(ulong)uVar3,&setter,&pitem,propertyRecordList._40_8_);
      pRVar8 = pRStack_60;
      if (iVar4 == 0) {
        pvStack_88 = (Var)0x0;
        propertyId = Js::PropertyRecord::GetPropertyId((PropertyRecord *)getter);
        BVar5 = Js::JavascriptOperators::GetOwnProperty
                          (pRVar8,propertyId,&stack0xffffffffffffff78,
                           (ScriptContext *)propertyRecordList._40_8_,(PropertyValueInfo *)0x0);
        if (BVar5 == 0) {
          TTDAbort_unrecoverable_error("Not sure what went wrong.");
        }
        EnqueueNewPathVarAsNeeded(this,pRStack_60,pvStack_88,(PropertyRecord *)getter,(char16 *)0x0)
        ;
      }
      else {
        if ((setter != (Var)0x0) &&
           (BVar5 = Js::JavascriptOperators::IsUndefinedObject(setter), BVar5 == 0)) {
          bVar1 = Js::VarIs<Js::JavascriptFunction>(setter);
          if (!bVar1) {
            TTDAbort_unrecoverable_error("The getter is not a function?");
          }
          EnqueueNewPathVarAsNeeded(this,pRStack_60,setter,(PropertyRecord *)getter,L">");
        }
        if ((pitem != (Var)0x0) &&
           (BVar5 = Js::JavascriptOperators::IsUndefinedObject(pitem), BVar5 == 0)) {
          bVar1 = Js::VarIs<Js::JavascriptFunction>(pitem);
          pRVar8 = pRStack_60;
          if (!bVar1) {
            TTDAbort_unrecoverable_error("The setter is not a function?");
          }
          val = Js::VarTo<Js::RecyclableObject>(pitem);
          EnqueueNewPathVarAsNeeded(this,pRVar8,val,(PropertyRecord *)getter,L"<");
        }
      }
    }
    TVar6 = Js::RecyclableObject::GetTypeId(pRStack_60);
    bVar1 = Js::DynamicType::Is(TVar6);
    if (bVar1) {
      pDVar10 = Js::VarTo<Js::DynamicObject,Js::RecyclableObject>(pRStack_60);
      val_00 = Js::DynamicObject::GetObjectArray(pDVar10);
      if (val_00 != (ArrayObject *)0x0) {
        EnqueueNewPathVarAsNeeded(this,pRStack_60,val_00,L"_object_array_",(char16 *)0x0);
      }
    }
    pRVar8 = Js::RecyclableObject::GetPrototype(pRStack_60);
    bVar1 = true;
    if (pRVar8 != (RecyclableObject *)0x0) {
      TVar6 = Js::RecyclableObject::GetTypeId(pRVar8);
      BVar5 = Js::JavascriptOperators::IsUndefinedOrNullType(TVar6);
      bVar1 = BVar5 != 0;
    }
    if (!bVar1) {
      EnqueueNewPathVarAsNeeded(this,pRStack_60,pRVar8,L"_proto_",(char16 *)0x0);
    }
    (*(pRStack_60->super_FinalizableObject).super_IRecyclerVisitedObject.
      _vptr_IRecyclerVisitedObject[0x5e])();
  } while( true );
}

Assistant:

void RuntimeContextInfo::GatherKnownObjectToPathMap(Js::ScriptContext* ctx)
    {
        JsUtil::List<const Js::PropertyRecord*, HeapAllocator> propertyRecordList(&HeapAllocator::Instance);

        this->EnqueueRootPathObject(_u("global"), ctx->GetGlobalObject());
        this->EnqueueRootPathObject(_u("null"), ctx->GetLibrary()->GetNull());
        this->EnqueueRootPathObject(_u("undeclBlockVar"), Js::VarTo<Js::RecyclableObject>(ctx->GetLibrary()->GetUndeclBlockVar()));

        this->EnqueueRootPathObject(_u("_defaultAccessor"), ctx->GetLibrary()->GetDefaultAccessorFunction());

        if(ctx->GetConfig()->IsErrorStackTraceEnabled())
        {
            this->EnqueueRootPathObject(_u("_stackTraceAccessor"), ctx->GetLibrary()->GetStackTraceAccessorFunction());
        }

        this->EnqueueRootPathObject(_u("_throwTypeErrorRestrictedPropertyAccessor"), ctx->GetLibrary()->GetThrowTypeErrorRestrictedPropertyAccessorFunction());

        this->EnqueueRootPathObject(_u("_identityFunction"), ctx->GetLibrary()->GetIdentityFunction());
        this->EnqueueRootPathObject(_u("_throwerFunction"), ctx->GetLibrary()->GetThrowerFunction());

       // ArrayIteratorPrototype is not created when we have JsBuiltins, it it created on-demand only
#ifdef ENABLE_JS_BUILTINS
        if (ctx->IsJsBuiltInEnabled())
        {
            ctx->GetLibrary()->EnsureArrayBuiltInsAreReady();
        }
#endif
        this->EnqueueRootPathObject(_u("_arrayIteratorPrototype"), ctx->GetLibrary()->GetArrayIteratorPrototype());
        this->EnqueueRootPathObject(_u("_mapIteratorPrototype"), ctx->GetLibrary()->GetMapIteratorPrototype());
        this->EnqueueRootPathObject(_u("_setIteratorPrototype"), ctx->GetLibrary()->GetSetIteratorPrototype());
        this->EnqueueRootPathObject(_u("_stringIteratorPrototype"), ctx->GetLibrary()->GetStringIteratorPrototype());

        this->EnqueueRootPathObject(_u("_generatorNextFunction"), ctx->GetLibrary()->EnsureGeneratorNextFunction());
        this->EnqueueRootPathObject(_u("_generatorReturnFunction"), ctx->GetLibrary()->EnsureGeneratorReturnFunction());
        this->EnqueueRootPathObject(_u("_generatorThrowFunction"), ctx->GetLibrary()->EnsureGeneratorThrowFunction());
        this->EnqueueRootPathObject(_u("_generatorFunctionConstructor"), ctx->GetLibrary()->GetGeneratorFunctionConstructor());
        this->EnqueueRootPathObject(_u("_asyncFunctionConstructor"), ctx->GetLibrary()->GetAsyncFunctionConstructor());

        uint32 counter = 0;
        while(!this->m_worklist.Empty())
        {
            Js::RecyclableObject* curr = this->m_worklist.Dequeue();

            counter++;

            ////
            //Handle the standard properties for all object types

            //load propArray with all property names
            propertyRecordList.Clear();
            LoadAndOrderPropertyNames(curr, propertyRecordList);

            //access each property and process the target objects as needed
            for(int32 i = 0; i < propertyRecordList.Count(); ++i)
            {
                const Js::PropertyRecord* precord = propertyRecordList.Item(i);

                Js::Var getter = nullptr;
                Js::Var setter = nullptr;
                if(curr->GetAccessors(precord->GetPropertyId(), &getter, &setter, ctx))
                {
                    if(getter != nullptr && !Js::JavascriptOperators::IsUndefinedObject(getter))
                    {
                        TTDAssert(Js::VarIs<Js::JavascriptFunction>(getter), "The getter is not a function?");
                        this->EnqueueNewPathVarAsNeeded(curr, getter, precord, _u(">"));
                    }

                    if(setter != nullptr && !Js::JavascriptOperators::IsUndefinedObject(setter))
                    {
                        TTDAssert(Js::VarIs<Js::JavascriptFunction>(setter), "The setter is not a function?");
                        this->EnqueueNewPathVarAsNeeded(curr, Js::VarTo<Js::RecyclableObject>(setter), precord, _u("<"));
                    }
                }
                else
                {
                    Js::Var pitem = nullptr;
                    BOOL isproperty = Js::JavascriptOperators::GetOwnProperty(curr, precord->GetPropertyId(), &pitem, ctx, nullptr);
                    TTDAssert(isproperty, "Not sure what went wrong.");

                    this->EnqueueNewPathVarAsNeeded(curr, pitem, precord, nullptr);
                }
            }

            //shouldn't have any dynamic array valued properties
            if(Js::DynamicType::Is(curr->GetTypeId()))
            {
                Js::ArrayObject* parray = Js::VarTo<Js::DynamicObject>(curr)->GetObjectArray();
                if(parray != nullptr)
                {
                    this->EnqueueNewPathVarAsNeeded(curr, parray, _u("_object_array_"));
                }
            }

            Js::RecyclableObject* proto = curr->GetPrototype();
            bool skipProto = (proto == nullptr) || Js::JavascriptOperators::IsUndefinedOrNullType(proto->GetTypeId());
            if(!skipProto)
            {
                this->EnqueueNewPathVarAsNeeded(curr, proto, _u("_proto_"));
            }

            curr->ProcessCorePaths();
        }

        SortDictIntoListOnNames<Js::RecyclableObject*>(this->m_coreObjToPathMap, this->m_sortedObjectList, this->m_nullString);
        SortDictIntoListOnNames<Js::FunctionBody*>(this->m_coreBodyToPathMap, this->m_sortedFunctionBodyList, this->m_nullString);
        SortDictIntoListOnNames<Js::DebuggerScope*>(this->m_coreDbgScopeToPathMap, this->m_sortedDbgScopeList, this->m_nullString);
    }